

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTestCase.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_0::ArraySizeValidator::validateSingleVariable
          (ArraySizeValidator *this,
          vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
          *path,string *resource,GLint propValue,string *implementationName)

{
  string *this_00;
  bool bVar1;
  int iVar2;
  size_type sVar3;
  VarType *pVVar4;
  TestLog *pTVar5;
  MessageBuilder *pMVar6;
  int local_3ac;
  int local_3a8;
  bool local_3a2;
  bool local_3a1;
  VariablePathComponent *local_398;
  allocator<char> local_381;
  string local_380;
  MessageBuilder local_360;
  MessageBuilder local_1d0;
  int local_50;
  bool local_4a;
  bool local_49;
  int arraySize;
  bool inUnsizedArray;
  bool isArray;
  VariablePathComponent *enclosingcomponent;
  VariablePathComponent nullComponent;
  string *implementationName_local;
  string *psStack_20;
  GLint propValue_local;
  string *resource_local;
  vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
  *path_local;
  ArraySizeValidator *this_local;
  
  nullComponent._8_8_ = implementationName;
  implementationName_local._4_4_ = propValue;
  psStack_20 = resource;
  resource_local = (string *)path;
  path_local = (vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
                *)this;
  ProgramInterfaceDefinition::VariablePathComponent::VariablePathComponent
            ((VariablePathComponent *)&enclosingcomponent);
  sVar3 = std::
          vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
          ::size((vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
                  *)resource_local);
  this_00 = resource_local;
  if (sVar3 < 2) {
    local_398 = (VariablePathComponent *)&enclosingcomponent;
  }
  else {
    sVar3 = std::
            vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
            ::size((vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
                    *)resource_local);
    local_398 = std::
                vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
                ::operator[]((vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
                              *)this_00,sVar3 - 2);
  }
  _arraySize = local_398;
  bVar1 = ProgramInterfaceDefinition::VariablePathComponent::isVariableType(local_398);
  local_3a1 = false;
  if (bVar1) {
    pVVar4 = ProgramInterfaceDefinition::VariablePathComponent::getVariableType(_arraySize);
    local_3a1 = glu::VarType::isArrayType(pVVar4);
  }
  local_49 = local_3a1;
  local_3a2 = false;
  if (local_3a1 != false) {
    pVVar4 = ProgramInterfaceDefinition::VariablePathComponent::getVariableType(_arraySize);
    iVar2 = glu::VarType::getArraySize(pVVar4);
    local_3a2 = iVar2 == -1;
  }
  local_4a = local_3a2;
  if ((local_49 & 1U) == 0) {
    local_3a8 = 1;
  }
  else {
    if (local_3a2 == false) {
      pVVar4 = ProgramInterfaceDefinition::VariablePathComponent::getVariableType(_arraySize);
      local_3ac = glu::VarType::getArraySize(pVVar4);
    }
    else {
      local_3ac = this->m_unsizedArraySize;
    }
    local_3a8 = local_3ac;
  }
  local_50 = local_3a8;
  pTVar5 = tcu::TestContext::getLog
                     ((this->super_SingleVariableValidator).super_PropValidator.m_testCtx);
  tcu::TestLog::operator<<(&local_1d0,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar6 = tcu::MessageBuilder::operator<<
                     (&local_1d0,(char (*) [33])"Verifying array size, expecting ");
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_50);
  tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1d0);
  if (local_50 != implementationName_local._4_4_) {
    pTVar5 = tcu::TestContext::getLog
                       ((this->super_SingleVariableValidator).super_PropValidator.m_testCtx);
    tcu::TestLog::operator<<(&local_360,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<(&local_360,(char (*) [13])"\tError, got ");
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(int *)((long)&implementationName_local + 4));
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_360);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_380,"resource array size invalid",&local_381);
    PropValidator::setError((PropValidator *)this,&local_380);
    std::__cxx11::string::~string((string *)&local_380);
    std::allocator<char>::~allocator(&local_381);
  }
  return;
}

Assistant:

void ArraySizeValidator::validateSingleVariable (const std::vector<VariablePathComponent>& path, const std::string& resource, glw::GLint propValue, const std::string& implementationName) const
{
	const VariablePathComponent		nullComponent;
	const VariablePathComponent&	enclosingcomponent	= (path.size() > 1) ? (path[path.size()-2]) : (nullComponent);

	const bool						isArray				= enclosingcomponent.isVariableType() && enclosingcomponent.getVariableType()->isArrayType();
	const bool						inUnsizedArray		= isArray && (enclosingcomponent.getVariableType()->getArraySize() == glu::VarType::UNSIZED_ARRAY);
	const int						arraySize			= (!isArray) ? (1) : (inUnsizedArray) ? (m_unsizedArraySize) : (enclosingcomponent.getVariableType()->getArraySize());

	DE_ASSERT(arraySize >= 0);
	DE_UNREF(resource);
	DE_UNREF(implementationName);

	m_testCtx.getLog() << tcu::TestLog::Message << "Verifying array size, expecting " << arraySize << tcu::TestLog::EndMessage;

	if (arraySize != propValue)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "\tError, got " << propValue << tcu::TestLog::EndMessage;
		setError("resource array size invalid");
	}
}